

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O0

idx_t duckdb::CalculateSliceLength<long>(idx_t begin,idx_t end,long step,bool svalid)

{
  InvalidInputException *this;
  ulong uVar1;
  unsigned_long uVar2;
  byte in_CL;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  allocator local_49;
  string local_48 [39];
  byte local_21;
  ulong local_20;
  long local_18;
  long local_10;
  unsigned_long local_8;
  
  local_21 = in_CL & 1;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if ((long)in_RDX < 0) {
    local_20 = AbsValue<long>(in_RDX);
  }
  if ((local_20 == 0) && ((local_21 & 1) != 0)) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"Slice step cannot be zero",&local_49);
    duckdb::InvalidInputException::InvalidInputException(this,local_48);
    __cxa_throw(this,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException)
    ;
  }
  if (local_20 == 1) {
    local_8 = NumericCast<unsigned_long,unsigned_long,void>(0xd697db);
  }
  else if (local_20 < (ulong)(local_18 - local_10)) {
    uVar1 = local_18 - local_10;
    uVar2 = UnsafeNumericCast<unsigned_long,long,void>(local_20);
    if (uVar1 % uVar2 == 0) {
      local_8 = UnsafeNumericCast<unsigned_long,long,void>(local_20);
      local_8 = (ulong)(local_18 - local_10) / local_8;
    }
    else {
      uVar2 = UnsafeNumericCast<unsigned_long,long,void>(local_20);
      local_8 = (ulong)(local_18 - local_10) / uVar2 + 1;
    }
  }
  else {
    local_8 = 1;
  }
  return local_8;
}

Assistant:

static idx_t CalculateSliceLength(idx_t begin, idx_t end, INDEX_TYPE step, bool svalid) {
	if (step < 0) {
		step = AbsValue(step);
	}
	if (step == 0 && svalid) {
		throw InvalidInputException("Slice step cannot be zero");
	}
	if (step == 1) {
		return NumericCast<idx_t>(end - begin);
	} else if (static_cast<idx_t>(step) >= (end - begin)) {
		return 1;
	}
	if ((end - begin) % UnsafeNumericCast<idx_t>(step) != 0) {
		return (end - begin) / UnsafeNumericCast<idx_t>(step) + 1;
	}
	return (end - begin) / UnsafeNumericCast<idx_t>(step);
}